

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O0

void processnonterm(parsenoderec *thisnode)

{
  int iVar1;
  int iVar2;
  parsenoderec *ppVar3;
  int local_20;
  int i;
  int prodnum;
  parsenoderec *p;
  parsenoderec *thisnode_local;
  
  currentlevel = thisnode->level + 1;
  iVar1 = prodtable[thisnode->ParseItem][thistoken];
  if (iVar1 == 0) {
    putchar(0x22);
    printlexeme(thistoken);
    error("\" cannot be used this way",linenum);
  }
  if (prodindex[iVar1].prlength != 0) {
    iVar2 = prodindex[iVar1].prstart + prodindex[iVar1].prlength + -1;
    ppVar3 = getparsenode(prodarray[iVar2].PrTermOrNonterm,prodarray[iVar2].PrParseItem);
    parsepush(ppVar3);
    for (local_20 = prodindex[iVar1].prstart + prodindex[iVar1].prlength + -2;
        prodindex[iVar1].prstart <= local_20; local_20 = local_20 + -1) {
      ppVar3 = getparsenode(prodarray[local_20].PrTermOrNonterm,prodarray[local_20].PrParseItem);
      parsepush(ppVar3);
    }
  }
  return;
}

Assistant:

void processnonterm(struct parsenoderec *thisnode)
{
    struct parsenoderec	*p;
    int	prodnum, i;
    
    currentlevel = thisnode -> level +1;
    if ((prodnum = prodtable[thisnode -> ParseItem][thistoken]) == 0){
        putchar('\"');
        printlexeme(thistoken);
        error("\" cannot be used this way", linenum);
    }
    
    if (prodindex[prodnum].prlength != 0)	{
        i = prodindex[prodnum].prstart + prodindex[prodnum].prlength - 1;
        p = getparsenode(prodarray[i].PrTermOrNonterm, prodarray[i].PrParseItem);
        parsepush(p);
        
        for (i = prodindex[prodnum].prstart + prodindex[prodnum].prlength - 2;
             i >= prodindex[prodnum].prstart;  --i)	{
            p = getparsenode(prodarray[i].PrTermOrNonterm, prodarray[i].PrParseItem);
            parsepush(p);
        }
    }
    
}